

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O3

int32 cmd_ln_parse_file(arg_t *defn,char *filename,int32 strict)

{
  int32 iVar1;
  cmd_ln_t *pcVar2;
  
  pcVar2 = cmd_ln_parse_file_r(global_cmdln,defn,filename,strict);
  if (pcVar2 == (cmd_ln_t *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    if (global_cmdln == (cmd_ln_t *)0x0) {
      iVar1 = 0;
      global_cmdln = pcVar2;
    }
  }
  return iVar1;
}

Assistant:

int
cmd_ln_parse_file(const arg_t * defn, const char *filename, int32 strict)
{
    cmd_ln_t *cmdln;

    cmdln = cmd_ln_parse_file_r(global_cmdln, defn, filename, strict);
    if (cmdln == NULL) {
        return -1;
    }
    /* Initialize global_cmdln if not present. */
    if (global_cmdln == NULL) {
        global_cmdln = cmdln;
    }
    return 0;
}